

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O3

idx_t duckdb::PhysicalRangeJoin::SelectJoinTail
                (ExpressionType *condition,Vector *left,Vector *right,SelectionVector *sel,
                idx_t count,SelectionVector *true_sel)

{
  idx_t iVar1;
  InternalException *this;
  string local_40;
  
  switch(*condition) {
  case COMPARE_BOUNDARY_START:
    iVar1 = VectorOperations::Equals
                      (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    break;
  case COMPARE_NOTEQUAL:
    iVar1 = VectorOperations::NotEquals
                      (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    break;
  case COMPARE_LESSTHAN:
    iVar1 = VectorOperations::LessThan
                      (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    break;
  case COMPARE_GREATERTHAN:
    iVar1 = VectorOperations::GreaterThan
                      (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    break;
  case COMPARE_LESSTHANOREQUALTO:
    iVar1 = VectorOperations::LessThanEquals
                      (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    break;
  case COMPARE_GREATERTHANOREQUALTO:
    iVar1 = VectorOperations::GreaterThanEquals
                      (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported comparison type for PhysicalRangeJoin","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case COMPARE_DISTINCT_FROM:
    iVar1 = VectorOperations::DistinctFrom
                      (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0);
    return iVar1;
  case COMPARE_BOUNDARY_END:
    iVar1 = VectorOperations::NotDistinctFrom
                      (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)0x0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

idx_t PhysicalRangeJoin::SelectJoinTail(const ExpressionType &condition, Vector &left, Vector &right,
                                        const SelectionVector *sel, idx_t count, SelectionVector *true_sel) {
	switch (condition) {
	case ExpressionType::COMPARE_NOTEQUAL:
		return VectorOperations::NotEquals(left, right, sel, count, true_sel, nullptr);
	case ExpressionType::COMPARE_LESSTHAN:
		return VectorOperations::LessThan(left, right, sel, count, true_sel, nullptr);
	case ExpressionType::COMPARE_GREATERTHAN:
		return VectorOperations::GreaterThan(left, right, sel, count, true_sel, nullptr);
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return VectorOperations::LessThanEquals(left, right, sel, count, true_sel, nullptr);
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return VectorOperations::GreaterThanEquals(left, right, sel, count, true_sel, nullptr);
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return VectorOperations::DistinctFrom(left, right, sel, count, true_sel, nullptr);
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		return VectorOperations::NotDistinctFrom(left, right, sel, count, true_sel, nullptr);
	case ExpressionType::COMPARE_EQUAL:
		return VectorOperations::Equals(left, right, sel, count, true_sel, nullptr);
	default:
		throw InternalException("Unsupported comparison type for PhysicalRangeJoin");
	}

	return count;
}